

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::SetUrl(ScriptContext *this,BSTR bstrUrl)

{
  code *pcVar1;
  bool bVar2;
  UINT UVar3;
  size_t sVar4;
  undefined4 *puVar5;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar6;
  UrlRecord *pUVar7;
  TrackAllocData local_50;
  char16_t *local_28;
  char16 *urlCopy;
  BSTR pWStack_18;
  charcount_t length;
  BSTR bstrUrl_local;
  ScriptContext *this_local;
  
  pWStack_18 = bstrUrl;
  bstrUrl_local = (BSTR)this;
  if ((this->url == (char16 *)0x0) || (sVar4 = PAL_wcslen(this->url), sVar4 != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x241,"(this->url != nullptr && PAL_wcslen(this->url) == 0)",
                                "this->url != nullptr && wcslen(this->url) == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  UVar3 = SysStringLen(pWStack_18);
  urlCopy._4_4_ = UVar3 + 1;
  pAVar6 = &GeneralAllocator(this)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&char16_t::typeinfo,0,(ulong)urlCopy._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x245);
  pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar6,&local_50);
  local_28 = Memory::AllocateArray<Memory::ArenaAllocator,char16_t,false>
                       ((Memory *)pAVar6,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)urlCopy._4_4_);
  js_memcpy_s(local_28,(ulong)(urlCopy._4_4_ - 1) << 1,pWStack_18,(ulong)(urlCopy._4_4_ - 1) << 1);
  local_28[urlCopy._4_4_ - 1] = L'\0';
  this->url = local_28;
  bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,LeakReportFlag);
  if (bVar2) {
    pUVar7 = Memory::LeakReport::LogUrl(local_28,(this->super_ScriptContextBase).globalObject);
    this->urlRecord = pUVar7;
  }
  return;
}

Assistant:

void ScriptContext::SetUrl(BSTR bstrUrl)
    {
        // Assumption: this method is never called multiple times
        Assert(this->url != nullptr && wcslen(this->url) == 0);

        charcount_t length = SysStringLen(bstrUrl) + 1; // Add 1 for the NULL.

        char16* urlCopy = AnewArray(this->GeneralAllocator(), char16, length);
        js_memcpy_s(urlCopy, (length - 1) * sizeof(char16), bstrUrl, (length - 1) * sizeof(char16));
        urlCopy[length - 1] = _u('\0');

        this->url = urlCopy;
#ifdef LEAK_REPORT
        if (Js::Configuration::Global.flags.IsEnabled(Js::LeakReportFlag))
        {
            this->urlRecord = LeakReport::LogUrl(urlCopy, this->globalObject);
        }
#endif
    }